

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

SetUpTearDownSuiteFuncType
testing::internal::
SuiteApiResolver<HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>_>
::GetTearDownCaseOrSuite(char *filename,int line_num)

{
  bool bVar1;
  size_t sVar2;
  GTestLog local_1c;
  
  bVar1 = IsTrue(true);
  if (!bVar1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/./gtest/internal/gtest-internal.h"
                       ,0x223);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (filename == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0xc4c678);
    }
    else {
      sVar2 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,line_num);
    GTestLog::~GTestLog(&local_1c);
  }
  return (SetUpTearDownSuiteFuncType)0x0;
}

Assistant:

static SetUpTearDownSuiteFuncType GetTearDownCaseOrSuite(const char* filename,
                                                           int line_num) {
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
    SetUpTearDownSuiteFuncType test_case_fp =
        GetNotDefaultOrNull(&T::TearDownTestCase, &Test::TearDownTestCase);
    SetUpTearDownSuiteFuncType test_suite_fp =
        GetNotDefaultOrNull(&T::TearDownTestSuite, &Test::TearDownTestSuite);

    GTEST_CHECK_(!test_case_fp || !test_suite_fp)
        << "Test can not provide both TearDownTestSuite and TearDownTestCase,"
           " please make sure there is only one present at"
        << filename << ":" << line_num;

    return test_case_fp != nullptr ? test_case_fp : test_suite_fp;
#else
    (void)(filename);
    (void)(line_num);
    return &T::TearDownTestSuite;
#endif
  }